

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool __thiscall
EthBasePort::ReadQuadletNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *data,uchar flags)

{
  ushort node_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  uint extraout_EDX;
  uchar *puVar5;
  undefined6 in_register_00000032;
  EthBasePort *this_00;
  ulong uVar6;
  allocator<char> local_65;
  int local_64;
  quadlet_t *local_60;
  nodeaddr_t local_58;
  string local_50 [32];
  
  local_64 = (int)CONCAT62(in_register_00000032,node);
  if (local_64 != 0x3f) {
    std::__cxx11::string::string<std::allocator<char>>(local_50,"ReadQuadlet",&local_65);
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_50,0);
    std::__cxx11::string::~string(local_50);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  local_60 = data;
  local_58 = addr;
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2f])(this);
  if (0 < iVar2) {
    poVar4 = std::operator<<((this->super_BasePort).outStr,"ReadQuadlet: flushed ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4," packets");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  this->fw_tl = this->fw_tl + 1 & 0x3f;
  BasePort::SetGenericBuffer(&this->super_BasePort);
  puVar5 = (this->super_BasePort).GenericBuffer;
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  puVar5 = puVar5 + uVar3;
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  node_00 = (ushort)local_64;
  uVar6 = (ulong)(ushort)local_64;
  (*(this->super_BasePort)._vptr_BasePort[0x31])
            (this,puVar5,(ulong)(iVar2 + 0x10),uVar6,(ulong)flags);
  make_write_header(this,puVar5,extraout_EDX,flags);
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  make_qread_packet(this,(quadlet_t *)(puVar5 + uVar3),node_00,local_58,(uint)this->fw_tl);
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                    (this,uVar6,puVar5,(ulong)(iVar2 + 0x10),(ulong)(flags >> 7));
  if ((char)iVar2 == '\0') {
    return false;
  }
  if (this->eth_read_callback != (EthCallbackType)0x0) {
    bVar1 = (*this->eth_read_callback)(this,(uchar)local_64,(this->super_BasePort).outStr);
    if (!bVar1) {
      poVar4 = std::operator<<((this->super_BasePort).outStr,
                               "ReadQuadlet: callback aborting (not reading packet)");
      goto LAB_00114eb8;
    }
  }
  puVar5 = (this->super_BasePort).GenericBuffer;
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x18])(this);
  puVar5 = puVar5 + uVar3;
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x2e])(this,puVar5,(ulong)(iVar2 + 0x1cU));
  if (uVar3 == iVar2 + 0x1cU) {
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
    ProcessExtraData(this,puVar5 + (ulong)uVar3 + 0x14);
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x32])(this,puVar5,(ulong)(flags >> 7));
    if ((char)iVar2 == '\0') {
      return false;
    }
    this_00 = this;
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
    ByteswapQuadlets(this_00,puVar5 + uVar3,0x14);
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
    bVar1 = CheckFirewirePacket(this,puVar5 + uVar3,0,node_00,6,(uint)this->fw_tl);
    if (bVar1) {
      uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
      *local_60 = *(quadlet_t *)(puVar5 + (ulong)uVar3 + 0xc);
      return true;
    }
    return false;
  }
  if (0xf < (this->super_BasePort).Node2Board[uVar6]) {
    return false;
  }
  poVar4 = std::operator<<((this->super_BasePort).outStr,
                           "ReadQuadlet: failed to receive read response from board ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," via UDP: return value = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
  poVar4 = std::operator<<(poVar4,", expected = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
LAB_00114eb8:
  std::endl<char,std::char_traits<char>>(poVar4);
  return false;
}

Assistant:

bool EthBasePort::ReadQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t &data, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("ReadQuadlet"))
        return false;

    // Flush before reading
    int numFlushed = PacketFlushAll();
    if (numFlushed > 0)
        outStr << "ReadQuadlet: flushed " << numFlushed << " packets" << std::endl;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    SetGenericBuffer();   // Make sure buffer is allocated

    unsigned char *sendPacket = GenericBuffer+GetWriteQuadAlign();
    unsigned int sendPacketSize = GetPrefixOffset(WR_FW_HEADER)+FW_QREAD_SIZE;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(sendPacket, sendPacketSize, node, flags);

    // Make control word
    make_write_header(sendPacket, sendPacketSize, flags);

    // Build FireWire packet
    make_qread_packet(reinterpret_cast<quadlet_t *>(sendPacket+GetPrefixOffset(WR_FW_HEADER)), node, addr, fw_tl);
    if (!PacketSend(node, sendPacket, sendPacketSize, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;

    // Invoke callback (if defined) between sending read request
    // and checking for read response. If callback returns false, we
    // skip checking for a received packet.
    if (eth_read_callback && !(*eth_read_callback)(*this, node, outStr)) {
        outStr << "ReadQuadlet: callback aborting (not reading packet)" << std::endl;
        return false;
    }

    unsigned char *recvPacket = GenericBuffer+GetReadQuadAlign();
    unsigned int recvPacketSize = GetPrefixOffset(RD_FW_HEADER)+FW_QRESPONSE_SIZE+FW_EXTRA_SIZE;
    int nRecv = PacketReceive(recvPacket, recvPacketSize);
    if (nRecv != static_cast<int>(recvPacketSize)) {
        // Only print message if Node2Board contains valid board number, to avoid unnecessary error messages during ScanNodes.
        unsigned int boardId = Node2Board[node];
        if (boardId < BoardIO::MAX_BOARDS) {
            outStr << "ReadQuadlet: failed to receive read response from board " << boardId
                   << " via UDP: return value = " << nRecv
                   << ", expected = " << recvPacketSize << std::endl;
        }
        return false;
    }

    ProcessExtraData(recvPacket+GetPrefixOffset(RD_FW_HEADER)+FW_QRESPONSE_SIZE);

    if (!CheckEthernetHeader(recvPacket, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;
    // Byteswap Firewire header (also swaps quadlet data)
    ByteswapQuadlets(recvPacket + GetPrefixOffset(RD_FW_HEADER), FW_QRESPONSE_SIZE);
    if (!CheckFirewirePacket(recvPacket+GetPrefixOffset(RD_FW_HEADER), 0, node, EthBasePort::QRESPONSE, fw_tl))
        return false;

    const quadlet_t *packet_FW = reinterpret_cast<const quadlet_t *>(recvPacket+GetPrefixOffset(RD_FW_HEADER));
    data = packet_FW[3];
    return true;
}